

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void mstltest2(void)

{
  void *pvVar1;
  double lambda;
  double *pdStack_4c8;
  int s_window;
  double *remainder;
  double *trend;
  double **seasonal;
  int iterate;
  int f [1];
  int Nseas;
  int j;
  int i;
  int N;
  double x [144];
  
  memcpy(&i,&DAT_0017eb00,0x480);
  iterate = 1;
  seasonal._4_4_ = 0xc;
  seasonal._0_4_ = 2;
  lambda._4_4_ = 0xd;
  trend = (double *)calloc(1,8);
  remainder = (double *)calloc(0x90,8);
  pdStack_4c8 = (double *)calloc(0x90,8);
  for (Nseas = 0; Nseas < iterate; Nseas = Nseas + 1) {
    pvVar1 = calloc(0x90,8);
    trend[Nseas] = (double)pvVar1;
  }
  mstl((double *)&i,0x90,(int *)((long)&seasonal + 4),&iterate,(int *)((long)&lambda + 4),
       (double *)0x0,(int *)&seasonal,(double **)trend,remainder,pdStack_4c8);
  for (Nseas = 0; Nseas < iterate; Nseas = Nseas + 1) {
    printf("\n Seasonal%d :\n",(ulong)*(uint *)((long)&seasonal + (long)Nseas * 4 + 4));
    for (f[0] = 0; f[0] < 0x90; f[0] = f[0] + 1) {
      printf("%g ",*(undefined8 *)((long)trend[Nseas] + (long)f[0] * 8));
    }
    printf("\n\n");
  }
  mdisplay(remainder,1,0x90);
  mdisplay(pdStack_4c8,1,0x90);
  free(trend);
  free(remainder);
  free(pdStack_4c8);
  return;
}

Assistant:

void mstltest2() {
	double x[144] = {112, 118, 132, 129, 121, 135, 148, 148, 136, 119, 104, 118,
        115, 126, 141, 135, 125, 149, 170, 170, 158, 133, 114, 140,
        145, 150, 178, 163, 172, 178, 199, 199, 184, 162, 146, 166,
        171, 180, 193, 181, 183, 218, 230, 242, 209, 191, 172, 194,
        196, 196, 236, 235, 229, 243, 264, 272, 237, 211, 180, 201,
        204, 188, 235, 227, 234, 264, 302, 293, 259, 229, 203, 229,
        242, 233, 267, 269, 270, 315, 364, 347, 312, 274, 237, 278,
        284, 277, 317, 313, 318, 374, 413, 405, 355, 306, 271, 306,
        315, 301, 356, 348, 355, 422, 465, 467, 404, 347, 305, 336,
        340, 318, 362, 348, 363, 435, 491, 505, 404, 359, 310, 337,
        360, 342, 406, 396, 420, 472, 548, 559, 463, 407, 362, 405,
        417, 391, 419, 461, 472, 535, 622, 606, 508, 461, 390, 432
	};

	int N = 144,i,j;
	int Nseas = 1;
	int f[1] = {12};
	int iterate = 2;
	double **seasonal,*trend,*remainder;
	int s_window = 13;
	double lambda;

	seasonal = (double**)calloc(Nseas,sizeof(double*));
	trend = (double*)calloc(N,sizeof(double));
	remainder = (double*)calloc(N,sizeof(double));

	for(i = 0; i < Nseas;++i) {
		seasonal[i] = (double*)calloc(N,sizeof(double));
	}

	mstl(x, N,f,&Nseas,&s_window,NULL,&iterate,seasonal,trend,remainder);

	for(i = 0; i < Nseas;++i) {
		printf("\n Seasonal%d :\n",f[i]);
		for(j = 0; j < N;++j) {
			printf("%g ",seasonal[i][j]);
		}
		printf("\n\n");
	}

	mdisplay(trend,1,N);
	mdisplay(remainder,1,N);
	free(seasonal);
	free(trend);
	free(remainder);
}